

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O3

void __thiscall libtorrent::aux::part_file::flush_metadata_impl(part_file *this,error_code *ec)

{
  byte bVar1;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  __node_base_ptr p_Var10;
  int val;
  uint uVar11;
  error_code *in_R9;
  undefined4 *__s;
  undefined4 *puVar12;
  string_view lhs;
  span<const_char> buf;
  string_view rhs;
  file_handle f;
  vector<char,_std::allocator<char>_> header;
  key_type local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [32];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  if (this->m_dirty_metadata != false) {
    if ((this->m_piece_map)._M_h._M_element_count == 0) {
      lhs._M_str = (char *)(this->m_name)._M_string_length;
      lhs._M_len = (size_t)(this->m_path)._M_dataplus._M_p;
      rhs._M_str = (char *)in_R9;
      rhs._M_len = (size_t)(this->m_name)._M_dataplus._M_p;
      combine_path_abi_cxx11_
                ((string *)(local_58 + 0x10),(libtorrent *)(this->m_path)._M_string_length,lhs,rhs);
      remove((libtorrent *)(local_58 + 0x10),(char *)ec);
      local_58._0_8_ = (pointer)0x100000002;
      local_58._8_8_ = &boost::system::detail::cat_holder<void>::generic_category_instance;
      iVar9 = (*ec->cat_->_vptr_error_category[2])(ec->cat_,(ulong)(uint)ec->val_);
      if (((char)iVar9 != '\0') ||
         (iVar9 = (*((error_category *)local_58._8_8_)->_vptr_error_category[3])
                            (local_58._8_8_,ec,local_58._0_8_ & 0xffffffff), (char)iVar9 != '\0')) {
        ec->val_ = 0;
        ec->failed_ = false;
        ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                    super_error_category;
      }
      if ((undefined1 *)local_48._0_8_ != local_58 + 0x20) {
        operator_delete((void *)local_48._0_8_,(ulong)(local_48._16_8_ + 1));
      }
    }
    else {
      open_file((part_file *)local_58,(open_mode_t)(uint)this,(error_code *)0x21);
      if (ec->failed_ == false) {
        ::std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)(local_58 + 0x10),
                   (long)this->m_header_size,(allocator_type *)&local_5c);
        uVar11 = this->m_max_pieces;
        uVar6 = (ushort)(uVar11 >> 0x10) & 0xff;
        uVar7 = (ushort)(uVar11 >> 8) & 0xff;
        uVar8 = (ushort)uVar11 & 0xff;
        bVar1 = (byte)(uVar11 >> 0x18);
        uVar5 = (ushort)bVar1;
        bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * bVar1 - (0xff < uVar5);
        bVar2 = ((uVar11 & 0xff0000) != 0) * (uVar6 < 0x100) * (char)(uVar11 >> 0x10) -
                (0xff < uVar6);
        bVar3 = ((uVar11 & 0xff00) != 0) * (uVar7 < 0x100) * (char)(uVar11 >> 8) - (0xff < uVar7);
        bVar4 = ((uVar11 & 0xff) != 0) * (uVar8 < 0x100) * (char)uVar11 - (0xff < uVar8);
        *(uint *)local_48._0_8_ =
             CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                      CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                               CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                        (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))));
        uVar11 = this->m_piece_size;
        uVar6 = (ushort)(uVar11 >> 0x10) & 0xff;
        uVar7 = (ushort)(uVar11 >> 8) & 0xff;
        uVar8 = (ushort)uVar11 & 0xff;
        bVar1 = (byte)(uVar11 >> 0x18);
        uVar5 = (ushort)bVar1;
        bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * bVar1 - (0xff < uVar5);
        bVar2 = ((uVar11 & 0xff0000) != 0) * (uVar6 < 0x100) * (char)(uVar11 >> 0x10) -
                (0xff < uVar6);
        bVar3 = ((uVar11 & 0xff00) != 0) * (uVar7 < 0x100) * (char)(uVar11 >> 8) - (0xff < uVar7);
        bVar4 = ((uVar11 & 0xff) != 0) * (uVar8 < 0x100) * (char)uVar11 - (0xff < uVar8);
        *(uint *)(local_48._0_8_ + 4) =
             CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                      CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                               CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                        (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))));
        __s = (undefined4 *)(local_48._0_8_ + 8);
        local_5c.m_val = 0;
        if (0 < this->m_max_pieces) {
          puVar12 = __s;
          do {
            p_Var10 = ::std::
                      _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::_M_find_before_node
                                (&(this->m_piece_map)._M_h,
                                 (ulong)(long)local_5c.m_val %
                                 (this->m_piece_map)._M_h._M_bucket_count,&local_5c,
                                 (long)local_5c.m_val);
            uVar11 = 0xffffffff;
            if ((p_Var10 != (__node_base_ptr)0x0) && (p_Var10->_M_nxt != (_Hash_node_base *)0x0)) {
              uVar11 = *(uint *)((long)&p_Var10->_M_nxt[1]._M_nxt + 4);
            }
            __s = puVar12 + 1;
            uVar6 = (ushort)(uVar11 >> 0x10) & 0xff;
            uVar7 = (ushort)(uVar11 >> 8) & 0xff;
            uVar8 = (ushort)uVar11 & 0xff;
            bVar1 = (byte)(uVar11 >> 0x18);
            uVar5 = (ushort)bVar1;
            bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * bVar1 - (0xff < uVar5);
            bVar2 = ((uVar11 & 0xff0000) != 0) * (uVar6 < 0x100) * (char)(uVar11 >> 0x10) -
                    (0xff < uVar6);
            bVar3 = ((uVar11 & 0xff00) != 0) * (uVar7 < 0x100) * (char)(uVar11 >> 8) -
                    (0xff < uVar7);
            bVar4 = ((uVar11 & 0xff) != 0) * (uVar8 < 0x100) * (char)uVar11 - (0xff < uVar8);
            *puVar12 = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                         CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 -
                                                  (0xff < bVar2),
                                                  (bVar1 != 0) * (bVar1 < 0x100) * bVar1 -
                                                  (0xff < bVar1))));
            local_5c.m_val = local_5c.m_val + 1;
            puVar12 = __s;
          } while (local_5c.m_val < this->m_max_pieces);
        }
        memset(__s,0,(size_t)(((long)this->m_header_size - (long)__s) + local_48._0_8_));
        buf.m_ptr = local_48._8_8_ - local_48._0_8_;
        buf.m_len = 0;
        pwrite_all((aux *)(local_58._0_8_ & 0xffffffff),(handle_type)local_48._0_8_,buf,(int64_t)ec,
                   in_R9);
        if (ec->failed_ == false) {
          this->m_dirty_metadata = false;
        }
        if ((undefined4 *)local_48._0_8_ != (undefined4 *)0x0) {
          operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
        }
      }
      file_handle::~file_handle((file_handle *)local_58);
    }
  }
  return;
}

Assistant:

void part_file::flush_metadata_impl(error_code& ec)
	{
		// do we need to flush the metadata?
		if (m_dirty_metadata == false) return;

		if (m_piece_map.empty())
		{
			// if we don't have any pieces left in the
			// part file, remove it
			std::string const p = combine_path(m_path, m_name);
			remove(p, ec);

			if (ec == boost::system::errc::no_such_file_or_directory)
				ec.clear();
			return;
		}

		auto f = open_file(aux::open_mode::write | aux::open_mode::hidden, ec);
		if (ec) return;

		std::vector<char> header(static_cast<std::size_t>(m_header_size));

		using namespace libtorrent::aux;

		char* ptr = header.data();
		write_uint32(m_max_pieces, ptr);
		write_uint32(m_piece_size, ptr);

		for (piece_index_t piece(0); piece < piece_index_t(m_max_pieces); ++piece)
		{
			auto const i = m_piece_map.find(piece);
			slot_index_t const slot(i == m_piece_map.end()
				? slot_index_t(-1) : i->second);
			write_int32(static_cast<int>(slot), ptr);
		}
		std::memset(ptr, 0, std::size_t(m_header_size - (ptr - header.data())));
		aux::pwrite_all(f.fd(), header, 0, ec);
		if (ec) return;
		m_dirty_metadata = false;
	}